

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

String __thiscall
xmrig::OclLib::getProgramBuildLog(OclLib *this,cl_program program,cl_device_id device)

{
  ulong __n;
  size_t sVar1;
  cl_int cVar2;
  char *__s;
  size_t sVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar4;
  size_t extraout_RDX_01;
  String SVar5;
  size_t size;
  size_t local_38;
  
  local_38 = 0;
  cVar2 = getProgramBuildInfo(program,device,0x1183,0,(void *)0x0,&local_38);
  sVar1 = local_38;
  sVar4 = extraout_RDX;
  if (cVar2 == 0) {
    __n = local_38 + 1;
    __s = (char *)operator_new__(__n);
    memset(__s,0,__n);
    cVar2 = getProgramBuildInfo(program,device,0x1183,sVar1,__s,(size_t *)0x0);
    if (cVar2 == 0) {
      *(char **)this = __s;
      sVar3 = strlen(__s);
      *(size_t *)(this + 8) = sVar3;
      sVar4 = extraout_RDX_01;
      goto LAB_00167918;
    }
    operator_delete__(__s);
    sVar4 = extraout_RDX_00;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_00167918:
  SVar5.m_size = sVar4;
  SVar5.m_data = (char *)this;
  return SVar5;
}

Assistant:

xmrig::String xmrig::OclLib::getProgramBuildLog(cl_program program, cl_device_id device) noexcept
{
    size_t size = 0;
    if (getProgramBuildInfo(program, device, CL_PROGRAM_BUILD_LOG, 0, nullptr, &size) != CL_SUCCESS) {
        return String();
    }

    char *log = new char[size + 1]();

    if (getProgramBuildInfo(program, device, CL_PROGRAM_BUILD_LOG, size, log, nullptr) != CL_SUCCESS) {
        delete [] log;
        return String();
    }

    return log;
}